

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB_STL_utils.cpp
# Opt level: O3

void __thiscall
amrex::STLtools::getIntercept
          (STLtools *this,Array<Array4<Real>,_3> *inter_arr,
          Array<Array4<const_EB2::Type_t>,_3> *type_arr,Array4<const_double> *lst,Geometry *geom,
          RunOn param_5,Box *param_6)

{
  Real *pRVar1;
  Real *pRVar2;
  double *pdVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  uint uVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  pointer pTVar26;
  pointer pXVar27;
  double *pdVar28;
  long lVar29;
  long lVar30;
  uint *puVar31;
  long lVar32;
  long lVar33;
  double *pdVar34;
  long lVar35;
  long lVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  double dVar43;
  XDim3 *pXVar44;
  ulong uVar45;
  int iVar46;
  long lVar47;
  double *pdVar48;
  long lVar49;
  long lVar50;
  long lVar51;
  bool bVar52;
  uint uVar53;
  int iVar54;
  long lVar55;
  ulong uVar56;
  long lVar57;
  long lVar58;
  Real *pRVar59;
  long lVar60;
  pointer pXVar61;
  ulong uVar62;
  uint uVar63;
  Real *pRVar64;
  double dVar65;
  double dVar66;
  double dVar67;
  double dVar68;
  double dVar69;
  double dVar70;
  undefined4 uVar71;
  undefined4 uVar72;
  ulong uVar73;
  double dVar74;
  double dVar75;
  double dVar76;
  double dVar79;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  double dVar80;
  double dVar81;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  
  uVar15 = this->m_num_tri;
  uVar45 = (ulong)uVar15;
  dVar4 = (geom->prob_domain).xlo[0];
  dVar5 = (geom->prob_domain).xlo[1];
  dVar6 = (geom->prob_domain).xlo[2];
  dVar7 = (geom->super_CoordSys).dx[0];
  dVar8 = (geom->super_CoordSys).dx[1];
  dVar9 = (geom->super_CoordSys).dx[2];
  pTVar26 = (this->m_tri_pts_d).m_data;
  pXVar27 = (this->m_tri_normals_d).m_data;
  pdVar28 = lst->p;
  lVar29 = lst->jstride;
  lVar30 = lst->kstride;
  lVar50 = (long)(lst->begin).x;
  lVar51 = (long)(lst->begin).y;
  iVar16 = (lst->begin).z;
  pRVar1 = &pXVar27->z;
  pRVar2 = &(pTVar26->v3).z;
  lVar49 = 0;
  do {
    iVar17 = inter_arr->_M_elems[lVar49].begin.z;
    iVar18 = inter_arr->_M_elems[lVar49].end.z;
    if (iVar17 < iVar18) {
      iVar19 = inter_arr->_M_elems[lVar49].end.x;
      iVar20 = inter_arr->_M_elems[lVar49].end.y;
      puVar31 = type_arr->_M_elems[lVar49].p;
      lVar32 = type_arr->_M_elems[lVar49].jstride;
      lVar33 = type_arr->_M_elems[lVar49].kstride;
      iVar21 = type_arr->_M_elems[lVar49].begin.z;
      pdVar34 = inter_arr->_M_elems[lVar49].p;
      lVar35 = inter_arr->_M_elems[lVar49].jstride;
      lVar36 = inter_arr->_M_elems[lVar49].kstride;
      iVar22 = type_arr->_M_elems[lVar49].begin.y;
      iVar23 = type_arr->_M_elems[lVar49].begin.x;
      iVar24 = inter_arr->_M_elems[lVar49].begin.y;
      iVar25 = inter_arr->_M_elems[lVar49].begin.x;
      iVar46 = iVar17;
      do {
        if (iVar24 < iVar20) {
          lVar60 = (iVar46 - iVar16) * lVar30;
          dVar74 = (double)iVar46 * dVar9 + dVar6;
          dVar37 = (double)(iVar46 + 1) * dVar9 + dVar6;
          lVar47 = (long)iVar24;
          do {
            if (iVar25 < iVar19) {
              uVar56 = lVar47 + 1;
              lVar55 = (lVar47 - lVar51) * lVar29;
              dVar39 = (double)(int)lVar47 * dVar8 + dVar5;
              dVar38 = (double)(int)uVar56 * dVar8 + dVar5;
              lVar57 = (long)iVar25;
              do {
                dVar70 = NAN;
                if (puVar31[((long)iVar46 - (long)iVar21) * lVar33 +
                            (lVar47 - iVar22) * lVar32 + (lVar57 - iVar23)] == 2) {
                  dVar43 = (double)(int)lVar57 * dVar7 + dVar4;
                  if ((int)lVar49 == 1) {
                    if ((int)uVar15 < 1) {
                      uVar62 = 0;
                      dVar70 = NAN;
LAB_00647e8d:
                      if ((uint)uVar62 != uVar15) goto LAB_00647f47;
                      dVar66 = pdVar28[lVar55 + lVar60 + (lVar57 - lVar50)];
                    }
                    else {
                      dVar66 = pdVar28[lVar55 + lVar60 + (lVar57 - lVar50)];
                      uVar62 = 0;
                      pRVar59 = pRVar1;
                      pRVar64 = pRVar2;
                      do {
                        dVar69 = pRVar59[-1];
                        dVar70 = 0.0;
                        bVar52 = false;
                        if ((dVar69 <= 0.0 ||
                             pdVar28[lVar60 + (uVar56 - lVar51) * lVar29 + (lVar57 - lVar50)] -
                             dVar66 <= 0.0) &&
                           (0.0 <= dVar69 ||
                            0.0 <= pdVar28[lVar60 + (uVar56 - lVar51) * lVar29 + (lVar57 - lVar50)]
                                   - dVar66)) {
                          dVar10 = pRVar64[-7];
                          dVar11 = pRVar64[-4];
                          dVar12 = pRVar64[-1];
                          dVar65 = dVar11;
                          if (dVar11 <= dVar10) {
                            dVar65 = dVar10;
                          }
                          dVar68 = dVar12;
                          if (dVar12 <= dVar65) {
                            dVar68 = dVar65;
                          }
                          if (dVar39 <= dVar68) {
                            dVar65 = dVar11;
                            if (dVar10 <= dVar11) {
                              dVar65 = dVar10;
                            }
                            dVar68 = dVar12;
                            if (dVar65 <= dVar12) {
                              dVar68 = dVar65;
                            }
                            if (dVar68 <= dVar38) {
                              dVar65 = pRVar64[-6];
                              dVar68 = pRVar64[-3];
                              dVar13 = *pRVar64;
                              dVar67 = dVar68;
                              if (dVar68 <= dVar65) {
                                dVar67 = dVar65;
                              }
                              dVar14 = dVar13;
                              if (dVar13 <= dVar67) {
                                dVar14 = dVar67;
                              }
                              if (dVar74 <= dVar14) {
                                dVar67 = dVar68;
                                if (dVar65 <= dVar68) {
                                  dVar67 = dVar65;
                                }
                                dVar14 = dVar13;
                                if (dVar67 <= dVar13) {
                                  dVar14 = dVar67;
                                }
                                if (dVar14 <= dVar74) {
                                  dVar67 = pRVar64[-8];
                                  dVar14 = pRVar64[-5];
                                  dVar80 = ((XDim3 *)(pRVar64 + -2))->x;
                                  dVar76 = dVar14;
                                  if (dVar14 <= dVar67) {
                                    dVar76 = dVar67;
                                  }
                                  dVar75 = dVar80;
                                  if (dVar80 <= dVar76) {
                                    dVar75 = dVar76;
                                  }
                                  if (dVar43 <= dVar75) {
                                    uVar71 = SUB84(dVar14,0);
                                    uVar72 = (int)((ulong)dVar14 >> 0x20);
                                    if (dVar67 <= dVar14) {
                                      uVar71 = SUB84(dVar67,0);
                                      uVar72 = (int)((ulong)dVar67 >> 0x20);
                                    }
                                    dVar76 = dVar80;
                                    if ((double)CONCAT44(uVar72,uVar71) <= dVar80) {
                                      dVar76 = (double)CONCAT44(uVar72,uVar71);
                                    }
                                    if (dVar76 <= dVar43) {
                                      if ((dVar69 != 0.0) || (NAN(dVar69))) {
                                        dVar76 = (dVar43 - dVar14) * (dVar68 - dVar65) -
                                                 (dVar14 - dVar67) * (dVar74 - dVar68);
                                        dVar75 = (dVar43 - dVar67) * (dVar65 - dVar13) -
                                                 (dVar67 - dVar80) * (dVar74 - dVar65);
                                        auVar41._8_8_ =
                                             -(ulong)(ABS(dVar75) < 2.220446049250313e-16);
                                        auVar41._0_8_ =
                                             -(ulong)(ABS(dVar76) < 2.220446049250313e-16);
                                        uVar63 = movmskpd(0,auVar41);
                                        if (((uVar63 & 2) != 0) ||
                                           ((((uVar63 & 1) != 0 ||
                                             (dVar79 = (dVar43 - dVar80) * (dVar13 - dVar68) -
                                                       (dVar80 - dVar14) * (dVar74 - dVar13),
                                             ABS(dVar79) < 2.220446049250313e-16)) ||
                                            (auVar77._0_8_ = (ulong)dVar76 & 0x8000000000000000,
                                            auVar77._8_8_ = (ulong)dVar75 & 0x8000000000000000,
                                            auVar83._0_8_ = (ulong)dVar79 & 0x8000000000000000,
                                            auVar83._8_8_ = (ulong)dVar79 & 0x8000000000000000,
                                            auVar84._8_8_ =
                                                 -(ulong)(SUB168(auVar83 | _DAT_00666bc0,8) ==
                                                         SUB168(auVar77 | _DAT_00666bc0,8)),
                                            auVar84._0_8_ =
                                                 -(ulong)(SUB168(auVar83 | _DAT_00666bc0,0) ==
                                                         SUB168(auVar77 | _DAT_00666bc0,0)),
                                            iVar54 = movmskpd(uVar63,auVar84), iVar54 == 3)))) {
                                          dVar69 = (((dVar67 + dVar14 + dVar80) * 0.3333333333333333
                                                     * ((XDim3 *)(pRVar59 + -2))->x +
                                                    (dVar10 + dVar11 + dVar12) * 0.3333333333333333
                                                    * dVar69 +
                                                    (dVar65 + dVar68 + dVar13) * 0.3333333333333333
                                                    * *pRVar59) -
                                                   (*pRVar59 * dVar74 +
                                                   ((XDim3 *)(pRVar59 + -2))->x * dVar43)) / dVar69;
                                          bVar52 = true;
                                          dVar70 = dVar39;
                                          if (((2.220446049250313e-16 <= ABS(dVar39 - dVar69)) &&
                                              (bVar52 = true, dVar70 = dVar38,
                                              2.220446049250313e-16 <= ABS(dVar38 - dVar69))) &&
                                             (bVar52 = dVar39 < dVar69 && dVar69 < dVar38,
                                             dVar70 = dVar69, dVar39 >= dVar69 || dVar69 >= dVar38))
                                          {
                                            dVar70 = 0.0;
                                          }
                                          goto LAB_0064768f;
                                        }
                                      }
                                      bVar52 = false;
                                      goto LAB_0064768f;
                                    }
                                  }
                                  bVar52 = false;
                                  goto LAB_0064768f;
                                }
                              }
                              bVar52 = false;
                              goto LAB_0064768f;
                            }
                          }
                          bVar52 = false;
                        }
LAB_0064768f:
                        if (bVar52) goto LAB_00647e8d;
                        uVar62 = uVar62 + 1;
                        pRVar59 = pRVar59 + 3;
                        pRVar64 = pRVar64 + 9;
                      } while (uVar45 != uVar62);
                    }
                    uVar62 = -(ulong)(0.0 < dVar66) & (ulong)dVar39;
                    uVar73 = ~-(ulong)(0.0 < dVar66) & (ulong)dVar38;
                  }
                  else {
                    if ((int)lVar49 == 0) {
                      dVar66 = (double)(int)(lVar57 + 1) * dVar7 + dVar4;
                      if ((int)uVar15 < 1) {
                        uVar63 = 0;
                        dVar70 = NAN;
LAB_00647e68:
                        if (uVar63 != uVar15) goto LAB_00647f47;
                        dVar69 = pdVar28[lVar55 + lVar60 + (lVar57 - lVar50)];
                      }
                      else {
                        dVar69 = pdVar28[lVar55 + lVar60 + (lVar57 - lVar50)];
                        lVar58 = 0;
                        uVar63 = 0;
                        pXVar61 = pXVar27;
                        do {
                          if (((0.0 < pdVar28[lVar55 + lVar60 + ((lVar57 + 1) - lVar50)] - dVar69)
                              && (0.0 < pXVar61->x)) ||
                             ((pdVar28[lVar55 + lVar60 + ((lVar57 + 1) - lVar50)] - dVar69 < 0.0 &&
                              (pXVar61->x <= 0.0 && pXVar61->x != 0.0)))) {
LAB_006471d6:
                            bVar52 = false;
                            dVar70 = 0.0;
                          }
                          else {
                            pdVar3 = (double *)((long)&(pTVar26->v1).x + lVar58);
                            dVar10 = *pdVar3;
                            dVar11 = pdVar3[3];
                            dVar70 = dVar11;
                            if (dVar11 <= dVar10) {
                              dVar70 = dVar10;
                            }
                            dVar12 = pdVar3[6];
                            dVar65 = dVar12;
                            if (dVar12 <= dVar70) {
                              dVar65 = dVar70;
                            }
                            if (dVar65 < dVar43) goto LAB_006471d6;
                            pdVar48 = (double *)((long)&(pTVar26->v2).x + lVar58);
                            dVar70 = dVar11;
                            if (dVar10 <= dVar11) {
                              dVar70 = dVar10;
                              pdVar48 = pdVar3;
                            }
                            if (dVar12 < dVar70) {
                              pdVar48 = (double *)((long)&(pTVar26->v3).x + lVar58);
                            }
                            if (dVar66 < *pdVar48) goto LAB_006471d6;
                            dVar65 = *(double *)((long)&(pTVar26->v1).y + lVar58);
                            dVar68 = *(double *)((long)&(pTVar26->v2).y + lVar58);
                            dVar70 = dVar68;
                            if (dVar68 <= dVar65) {
                              dVar70 = dVar65;
                            }
                            dVar13 = *(double *)((long)&(pTVar26->v3).y + lVar58);
                            dVar67 = dVar13;
                            if (dVar13 <= dVar70) {
                              dVar67 = dVar70;
                            }
                            dVar70 = 0.0;
                            if (dVar67 < dVar39) {
LAB_0064725c:
                              bVar52 = false;
                            }
                            else {
                              dVar67 = dVar68;
                              pXVar44 = &pTVar26->v2;
                              if (dVar65 <= dVar68) {
                                dVar67 = dVar65;
                                pXVar44 = &pTVar26->v1;
                              }
                              if (dVar13 < dVar67) {
                                pXVar44 = &pTVar26->v3;
                              }
                              if (dVar39 < *(double *)((long)&pXVar44->y + lVar58))
                              goto LAB_0064725c;
                              dVar67 = *(double *)((long)&(pTVar26->v1).z + lVar58);
                              dVar14 = *(double *)((long)&(pTVar26->v2).z + lVar58);
                              dVar80 = dVar14;
                              if (dVar14 <= dVar67) {
                                dVar80 = dVar67;
                              }
                              dVar76 = *(double *)((long)&(pTVar26->v3).z + lVar58);
                              dVar75 = dVar76;
                              if (dVar76 <= dVar80) {
                                dVar75 = dVar80;
                              }
                              if (dVar74 <= dVar75) {
                                dVar80 = dVar14;
                                pXVar44 = &pTVar26->v2;
                                if (dVar67 <= dVar14) {
                                  dVar80 = dVar67;
                                  pXVar44 = &pTVar26->v1;
                                }
                                pdVar3 = (double *)((long)&(pTVar26->v3).z + lVar58);
                                pdVar48 = (double *)((long)&pXVar44->z + lVar58);
                                if (dVar76 < dVar80) {
                                  pdVar48 = pdVar3;
                                }
                                if (dVar74 < *pdVar48) goto LAB_006472fd;
                                dVar80 = pXVar61->x;
                                if ((dVar80 == 0.0) && (!NAN(dVar80))) goto LAB_006471d6;
                                dVar75 = (dVar74 - dVar14) * (dVar68 - dVar65) -
                                         (dVar14 - dVar67) * (dVar39 - dVar68);
                                dVar79 = (dVar74 - dVar67) * (dVar65 - dVar13) -
                                         (dVar67 - dVar76) * (dVar39 - dVar65);
                                auVar42._8_8_ = -(ulong)(ABS(dVar79) < 2.220446049250313e-16);
                                auVar42._0_8_ = -(ulong)(ABS(dVar75) < 2.220446049250313e-16);
                                uVar53 = movmskpd((int)pdVar3,auVar42);
                                if (((((uVar53 & 2) == 0) && ((uVar53 & 1) == 0)) &&
                                    (dVar81 = (dVar74 - dVar76) * (dVar13 - dVar68) -
                                              (dVar76 - dVar14) * (dVar39 - dVar13),
                                    2.220446049250313e-16 <= ABS(dVar81))) &&
                                   (auVar82._8_8_ =
                                         -(ulong)((double)((ulong)dVar81 & 0x8000000000000000 |
                                                          0x3ff0000000000000) ==
                                                 (double)((ulong)dVar79 & 0x8000000000000000 |
                                                         0x3ff0000000000000)),
                                   auVar82._0_8_ =
                                        -(ulong)((double)((ulong)dVar81 & 0x8000000000000000 |
                                                         0x3ff0000000000000) ==
                                                (double)((ulong)dVar75 & 0x8000000000000000 |
                                                        0x3ff0000000000000)),
                                   iVar54 = movmskpd(uVar53,auVar82), iVar54 != 3))
                                goto LAB_0064725c;
                                dVar80 = (((dVar67 + dVar14 + dVar76) * 0.3333333333333333 *
                                           pXVar61->z +
                                          (dVar10 + dVar11 + dVar12) * 0.3333333333333333 * dVar80 +
                                          (dVar65 + dVar68 + dVar13) * 0.3333333333333333 *
                                          pXVar61->y) - (pXVar61->y * dVar39 + pXVar61->z * dVar74))
                                         / dVar80;
                                bVar52 = true;
                                dVar70 = dVar43;
                                if (((2.220446049250313e-16 <= ABS(dVar43 - dVar80)) &&
                                    (bVar52 = true, dVar70 = dVar66,
                                    2.220446049250313e-16 <= ABS(dVar66 - dVar80))) &&
                                   (bVar52 = dVar43 < dVar80 && dVar80 < dVar66, dVar70 = dVar80,
                                   dVar43 >= dVar80 || dVar80 >= dVar66)) {
                                  dVar70 = 0.0;
                                }
                              }
                              else {
LAB_006472fd:
                                bVar52 = false;
                              }
                            }
                          }
                          if (bVar52) goto LAB_00647e68;
                          uVar63 = uVar63 + 1;
                          lVar58 = lVar58 + 0x48;
                          pXVar61 = pXVar61 + 1;
                        } while (uVar45 * 0x48 != lVar58);
                      }
                      dVar70 = (double)(~-(ulong)(0.0 < dVar69) & (ulong)dVar66 |
                                       (ulong)dVar43 & -(ulong)(0.0 < dVar69));
                      goto LAB_00647f47;
                    }
                    if ((int)uVar15 < 1) {
                      uVar62 = 0;
                      dVar70 = NAN;
LAB_00647eb2:
                      if ((uint)uVar62 != uVar15) goto LAB_00647f47;
                      dVar66 = pdVar28[lVar55 + lVar60 + (lVar57 - lVar50)];
                    }
                    else {
                      dVar66 = pdVar28[lVar55 + (lVar57 - lVar50) + lVar60];
                      uVar62 = 0;
                      pRVar59 = pRVar1;
                      pRVar64 = pRVar2;
                      do {
                        dVar69 = *pRVar59;
                        dVar70 = 0.0;
                        bVar52 = false;
                        if ((0.0 < dVar69 &&
                             0.0 < pdVar28[lVar55 + (lVar57 - lVar50) +
                                                    ((iVar46 + 1) - iVar16) * lVar30] - dVar66) ||
                           (dVar69 < 0.0 &&
                            pdVar28[lVar55 + (lVar57 - lVar50) + ((iVar46 + 1) - iVar16) * lVar30] -
                            dVar66 < 0.0)) goto LAB_00647b3d;
                        dVar10 = pRVar64[-6];
                        dVar11 = pRVar64[-3];
                        dVar12 = *pRVar64;
                        dVar65 = dVar11;
                        if (dVar11 <= dVar10) {
                          dVar65 = dVar10;
                        }
                        dVar68 = dVar12;
                        if (dVar12 <= dVar65) {
                          dVar68 = dVar65;
                        }
                        if (dVar74 <= dVar68) {
                          dVar65 = dVar11;
                          if (dVar10 <= dVar11) {
                            dVar65 = dVar10;
                          }
                          dVar68 = dVar12;
                          if (dVar65 <= dVar12) {
                            dVar68 = dVar65;
                          }
                          if (dVar37 < dVar68) goto LAB_00647ae8;
                          dVar65 = pRVar64[-8];
                          dVar68 = pRVar64[-5];
                          dVar13 = ((XDim3 *)(pRVar64 + -2))->x;
                          dVar67 = dVar68;
                          if (dVar68 <= dVar65) {
                            dVar67 = dVar65;
                          }
                          dVar14 = dVar13;
                          if (dVar13 <= dVar67) {
                            dVar14 = dVar67;
                          }
                          if (dVar14 < dVar43) {
LAB_00647b32:
                            bVar52 = false;
                          }
                          else {
                            dVar67 = dVar68;
                            if (dVar65 <= dVar68) {
                              dVar67 = dVar65;
                            }
                            dVar14 = dVar13;
                            if (dVar67 <= dVar13) {
                              dVar14 = dVar67;
                            }
                            if (dVar43 < dVar14) goto LAB_00647b32;
                            dVar67 = pRVar64[-7];
                            dVar14 = pRVar64[-4];
                            dVar80 = pRVar64[-1];
                            dVar76 = dVar14;
                            if (dVar14 <= dVar67) {
                              dVar76 = dVar67;
                            }
                            dVar75 = dVar80;
                            if (dVar80 <= dVar76) {
                              dVar75 = dVar76;
                            }
                            if (dVar39 <= dVar75) {
                              uVar71 = SUB84(dVar14,0);
                              uVar72 = (int)((ulong)dVar14 >> 0x20);
                              if (dVar67 <= dVar14) {
                                uVar71 = SUB84(dVar67,0);
                                uVar72 = (int)((ulong)dVar67 >> 0x20);
                              }
                              dVar76 = dVar80;
                              if ((double)CONCAT44(uVar72,uVar71) <= dVar80) {
                                dVar76 = (double)CONCAT44(uVar72,uVar71);
                              }
                              if ((dVar76 <= dVar39) && ((dVar69 != 0.0 || (NAN(dVar69))))) {
                                dVar76 = (dVar39 - dVar14) * (dVar68 - dVar65) -
                                         (dVar14 - dVar67) * (dVar43 - dVar68);
                                dVar75 = (dVar39 - dVar67) * (dVar65 - dVar13) -
                                         (dVar67 - dVar80) * (dVar43 - dVar65);
                                auVar40._8_8_ = -(ulong)(ABS(dVar75) < 2.220446049250313e-16);
                                auVar40._0_8_ = -(ulong)(ABS(dVar76) < 2.220446049250313e-16);
                                uVar63 = movmskpd(0,auVar40);
                                if (((uVar63 & 2) != 0) ||
                                   ((((uVar63 & 1) != 0 ||
                                     (dVar79 = (dVar39 - dVar80) * (dVar13 - dVar68) -
                                               (dVar80 - dVar14) * (dVar43 - dVar13),
                                     ABS(dVar79) < 2.220446049250313e-16)) ||
                                    (auVar78._0_8_ = (ulong)dVar76 & 0x8000000000000000,
                                    auVar78._8_8_ = (ulong)dVar75 & 0x8000000000000000,
                                    auVar85._0_8_ = (ulong)dVar79 & 0x8000000000000000,
                                    auVar85._8_8_ = (ulong)dVar79 & 0x8000000000000000,
                                    auVar86._8_8_ =
                                         -(ulong)(SUB168(auVar85 | _DAT_00666bc0,8) ==
                                                 SUB168(auVar78 | _DAT_00666bc0,8)),
                                    auVar86._0_8_ =
                                         -(ulong)(SUB168(auVar85 | _DAT_00666bc0,0) ==
                                                 SUB168(auVar78 | _DAT_00666bc0,0)),
                                    iVar54 = movmskpd(uVar63,auVar86), iVar54 == 3)))) {
                                  dVar69 = (((dVar67 + dVar14 + dVar80) * 0.3333333333333333 *
                                             pRVar59[-1] +
                                            (dVar10 + dVar11 + dVar12) * 0.3333333333333333 * dVar69
                                            + (dVar65 + dVar68 + dVar13) * 0.3333333333333333 *
                                              ((XDim3 *)(pRVar59 + -2))->x) -
                                           (((XDim3 *)(pRVar59 + -2))->x * dVar43 +
                                           pRVar59[-1] * dVar39)) / dVar69;
                                  bVar52 = true;
                                  dVar70 = dVar74;
                                  if (((2.220446049250313e-16 <= ABS(dVar74 - dVar69)) &&
                                      (bVar52 = true, dVar70 = dVar37,
                                      2.220446049250313e-16 <= ABS(dVar37 - dVar69))) &&
                                     (bVar52 = dVar74 < dVar69 && dVar69 < dVar37, dVar70 = dVar69,
                                     dVar74 >= dVar69 || dVar69 >= dVar37)) {
                                    dVar70 = 0.0;
                                  }
                                  goto LAB_00647b3d;
                                }
                              }
                              goto LAB_00647b32;
                            }
                            bVar52 = false;
                          }
                        }
                        else {
LAB_00647ae8:
                          bVar52 = false;
                        }
LAB_00647b3d:
                        if (bVar52) goto LAB_00647eb2;
                        uVar62 = uVar62 + 1;
                        pRVar59 = pRVar59 + 3;
                        pRVar64 = pRVar64 + 9;
                      } while (uVar45 != uVar62);
                    }
                    uVar62 = -(ulong)(0.0 < dVar66) & (ulong)dVar74;
                    uVar73 = ~-(ulong)(0.0 < dVar66) & (ulong)dVar37;
                  }
                  dVar70 = (double)(uVar73 | uVar62);
                }
LAB_00647f47:
                pdVar34[(iVar46 - iVar17) * lVar36 + (lVar47 - iVar24) * lVar35 + (lVar57 - iVar25)]
                     = dVar70;
                lVar57 = lVar57 + 1;
              } while (iVar19 != (int)lVar57);
            }
            else {
              uVar56 = lVar47 + 1U & 0xffffffff;
            }
            lVar47 = lVar47 + 1;
          } while ((int)uVar56 != iVar20);
        }
        iVar46 = iVar46 + 1;
      } while (iVar46 != iVar18);
    }
    lVar49 = lVar49 + 1;
    if (lVar49 == 3) {
      return;
    }
  } while( true );
}

Assistant:

void
STLtools::getIntercept (Array<Array4<Real>,AMREX_SPACEDIM> const& inter_arr,
                        Array<Array4<EB2::Type_t const>,AMREX_SPACEDIM> const& type_arr,
                        Array4<Real const> const& lst ,Geometry const& geom,
                        RunOn, Box const&) const
{
    int num_triangles = m_num_tri;

    const auto plo = geom.ProbLoArray();
    const auto dx  = geom.CellSizeArray();

    const Triangle* tri_pts = m_tri_pts_d.data();
    const XDim3* tri_norm = m_tri_normals_d.data();

    for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
        Array4<Real> const& inter = inter_arr[idim];
        Array4<EB2::Type_t const> const& type = type_arr[idim];
        const Box bx{inter};
        ParallelFor(bx, [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
        {
            Real r = std::numeric_limits<Real>::quiet_NaN();
            if (type(i,j,k) == EB2::Type::irregular) {
                XDim3 p1{plo[0]+i*dx[0],
                         plo[1]+j*dx[1],
#if (AMREX_SPACEDIM == 2)
                         Real(0.)
#else
                         plo[2]+k*dx[2]
#endif
                };
                if (idim == 0) {
                    Real x2 = plo[0]+(i+1)*dx[0];
                    int it;
                    for (it=0; it < num_triangles; ++it) {
                        auto const& tri = tri_pts[it];
                        auto tmp = edge_tri_intersects(p1.x, x2, p1.y, p1.z,
                                                       tri.v1, tri.v2, tri.v3,
                                                       tri_norm[it],
                                                       lst(i+1,j,k)-lst(i,j,k));
                        if (tmp.first) {
                            r = tmp.second;
                            break;
                        }
                    }
                    if (it == num_triangles) {
                        r = (lst(i,j,k) > 0._rt) ? p1.x : x2;
                    }
                } else if (idim == 1) {
                    Real y2 = plo[1]+(j+1)*dx[1];
                    int it;
                    for (it=0; it < num_triangles; ++it) {
                        auto const& tri = tri_pts[it];
                        auto const& norm = tri_norm[it];
                        auto tmp = edge_tri_intersects(p1.y, y2, p1.z, p1.x,
                                                       {tri.v1.y, tri.v1.z, tri.v1.x},
                                                       {tri.v2.y, tri.v2.z, tri.v2.x},
                                                       {tri.v3.y, tri.v3.z, tri.v3.x},
                                                       {  norm.y,   norm.z,   norm.x},
                                                       lst(i,j+1,k)-lst(i,j,k));
                        if (tmp.first) {
                            r = tmp.second;
                            break;
                        }
                    }
                    if (it == num_triangles) {
                        r = (lst(i,j,k) > 0._rt) ? p1.y : y2;
                    }
                } else {
                    Real z2 = plo[2]+(k+1)*dx[2];
                    int it;
                    for (it=0; it < num_triangles; ++it) {
                        auto const& tri = tri_pts[it];
                        auto const& norm = tri_norm[it];
                        auto tmp = edge_tri_intersects(p1.z, z2, p1.x, p1.y,
                                                       {tri.v1.z, tri.v1.x, tri.v1.y},
                                                       {tri.v2.z, tri.v2.x, tri.v2.y},
                                                       {tri.v3.z, tri.v3.x, tri.v3.y},
                                                       {  norm.z,   norm.x,   norm.y},
                                                       lst(i,j,k+1)-lst(i,j,k));
                        if (tmp.first) {
                            r = tmp.second;
                            break;
                        }
                    }
                    if (it == num_triangles) {
                        r = (lst(i,j,k) > 0._rt) ? p1.z : z2;
                    }
                }
            }
            inter(i,j,k) = r;
        });
    }
}